

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

map_index_t __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::BucketNumber
          (KeyMapBase<unsigned_int> *this,ViewType k)

{
  map_index_t mVar1;
  uint64_t uVar2;
  LogMessage *pLVar3;
  RealKeyToVariantKeyAlternative<unsigned_int,_void> local_69;
  undefined1 local_68 [16];
  LogMessageFatal local_58 [22];
  Voidify local_42;
  RealKeyToVariantKey<unsigned_int> local_41;
  VariantKey local_40;
  uint local_2c;
  RealKeyToVariantKeyAlternative<unsigned_int,_void> local_25;
  uint local_24;
  string *local_20;
  string *absl_log_internal_check_op_result;
  KeyMapBase<unsigned_int> *pKStack_10;
  ViewType k_local;
  KeyMapBase<unsigned_int> *this_local;
  
  absl_log_internal_check_op_result._4_4_ = k;
  pKStack_10 = this;
  uVar2 = RealKeyToVariantKeyAlternative<unsigned_int,_void>::operator()(&local_25,(ulong)k);
  mVar1 = UntypedMapBase::VariantBucketNumber(&this->super_UntypedMapBase,uVar2);
  local_24 = absl::lts_20240722::log_internal::GetReferenceableValue(mVar1);
  local_40 = RealKeyToVariantKey<unsigned_int>::operator()
                       (&local_41,absl_log_internal_check_op_result._4_4_);
  mVar1 = UntypedMapBase::VariantBucketNumber(&this->super_UntypedMapBase,local_40);
  local_2c = absl::lts_20240722::log_internal::GetReferenceableValue(mVar1);
  local_20 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                       (&local_24,&local_2c,
                        "VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k)) == VariantBucketNumber(RealKeyToVariantKey<Key>{}(k))"
                       );
  if (local_20 != (string *)0x0) {
    local_68 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map.h"
               ,0x467,local_68._0_8_,local_68._8_8_);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_58);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_42,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_58);
  }
  uVar2 = RealKeyToVariantKeyAlternative<unsigned_int,_void>::operator()
                    (&local_69,(ulong)absl_log_internal_check_op_result._4_4_);
  mVar1 = UntypedMapBase::VariantBucketNumber(&this->super_UntypedMapBase,uVar2);
  return mVar1;
}

Assistant:

map_index_t BucketNumber(typename TS::ViewType k) const {
    ABSL_DCHECK_EQ(
        VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k)),
        VariantBucketNumber(RealKeyToVariantKey<Key>{}(k)));
    return VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k));
  }